

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

prod_bitset * __thiscall
CppGenerator::computeLoopMasks
          (CppGenerator *this,prod_bitset presentFunctions,dyn_bitset *consideredLoops,
          var_bitset *varOrderBitset,var_bitset *relationBag,dyn_bitset *contributingViews,
          dyn_bitset *nextVariable,dyn_bitset *prefixLoops)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  View *pVVar4;
  ostream *poVar5;
  reference __src;
  dyn_bitset *in_RCX;
  long lVar6;
  CppGenerator *in_RDX;
  long in_RSI;
  undefined8 *puVar7;
  prod_bitset *in_RDI;
  undefined8 *puVar8;
  var_bitset *in_R8;
  var_bitset *in_R9;
  byte bVar9;
  reference rVar10;
  _Base_bitset<24UL> in_stack_00000000;
  dyn_bitset *in_stack_000000c0;
  dyn_bitset *in_stack_000000c8;
  prod_bitset nextLoopFunctions;
  dyn_bitset nextConsideredLoops;
  size_t viewID;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nextLoopIDs;
  size_t numOfLoops;
  size_t next;
  size_t view;
  size_t highestPosition;
  dyn_bitset remainingLoops;
  var_bitset *incViewBitset;
  size_t incID;
  size_t v;
  var_bitset *functionVars;
  size_t f;
  prod_bitset loopFunctionMask;
  dyn_bitset nextLoops;
  dyn_bitset loopFactors;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  value_type *in_stack_fffffffffffff928;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff930;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff938;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff940;
  size_type in_stack_fffffffffffff950;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff958;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff960;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff968;
  bitset<1500UL> *in_stack_fffffffffffff9e0;
  undefined8 local_4d0 [48];
  size_type local_350;
  reference local_328;
  ulong local_318;
  reference local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  size_type local_230;
  size_type local_228;
  reference local_220;
  size_t local_210;
  size_t local_208;
  var_bitset *local_180;
  ulong local_178;
  ulong local_170;
  Function *local_168;
  reference local_160;
  ulong local_150;
  dyn_bitset *in_stack_ffffffffffffffd0;
  
  bVar9 = 0;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b6f70);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b6f78);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b6f98);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffff940,(size_type)in_stack_fffffffffffff938,
             (unsigned_long)in_stack_fffffffffffff930,
             (allocator<unsigned_long> *)in_stack_fffffffffffff928);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b6fc8);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b6fd9);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b6fe1);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b7013);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffff940,(size_type)in_stack_fffffffffffff938,
             (unsigned_long)in_stack_fffffffffffff930,
             (allocator<unsigned_long> *)in_stack_fffffffffffff928);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b7043);
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b7050);
  local_150 = 0;
  do {
    if (0x5db < local_150) {
      local_230 = std::
                  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)(in_RSI + 0x550));
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      local_248 = 0;
      uStack_240 = 0;
      local_238 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b7821);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                  &in_stack_fffffffffffff918->m_bits);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                (&in_stack_fffffffffffff930->m_bits);
      local_250 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)(in_RSI + 0x5b0),local_230);
      std::bitset<1500UL>::operator~(in_stack_fffffffffffff9e0);
      std::bitset<1500UL>::operator&=
                ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                 (bitset<1500UL> *)in_stack_fffffffffffff918);
      local_318 = 0;
      while( true ) {
        uVar1 = local_318;
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2b78c0);
        sVar3 = QueryCompiler::numberOfViews((QueryCompiler *)0x2b78c8);
        if (sVar3 + 1 <= uVar1) break;
        rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928);
        local_328 = rVar10;
        bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_328);
        if (bVar2) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                     in_stack_fffffffffffff918);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    (in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928,
                     (bool)in_stack_fffffffffffff927);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                    (in_stack_fffffffffffff930);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    (in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928,
                     (bool)in_stack_fffffffffffff927);
          local_350 = std::
                      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RSI + 0x550));
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                     (value_type_conflict2 *)in_stack_fffffffffffff918);
          memcpy(local_4d0,&stack0x00000008,0xc0);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                     in_stack_fffffffffffff918);
          puVar7 = local_4d0;
          puVar8 = (undefined8 *)&stack0xfffffffffffff918;
          for (lVar6 = 0x18; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar8 = *puVar7;
            puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
            puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
          }
          computeLoopMasks(in_RDX,(prod_bitset)in_stack_00000000._M_w,in_RCX,in_R8,in_R9,
                           in_stack_ffffffffffffffd0,in_stack_000000c0,in_stack_000000c8);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b7ac6);
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                    ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     (in_RSI + 0x580),local_230);
          std::bitset<1500UL>::operator|=
                    ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920)
                     ,(bitset<1500UL> *)in_stack_fffffffffffff918);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b7aff);
        }
        local_318 = local_318 + 1;
      }
      __src = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                        ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                         (in_RSI + 0x580),local_230);
      memcpy(in_RDI,__src,0xc0);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b7bc6);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b7bd3);
      return in_RDI;
    }
    std::bitset<1500UL>::operator[]
              ((bitset<1500UL> *)in_stack_fffffffffffff928,
               CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    bVar2 = std::bitset::reference::operator_cast_to_bool
                      ((reference *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::bitset<1500UL>::reference::~reference(&local_160);
    if (bVar2) {
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2b70cf);
      local_168 = QueryCompiler::getFunction
                            ((QueryCompiler *)
                             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                             (size_t)in_stack_fffffffffffff918);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (in_stack_fffffffffffff930);
      for (local_170 = 0; local_170 < 100; local_170 = local_170 + 1) {
        bVar2 = std::bitset<100UL>::operator[]
                          ((bitset<100UL> *)
                           CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                           (size_t)in_stack_fffffffffffff918);
        if (bVar2) {
          bVar2 = std::bitset<100UL>::operator[]
                            ((bitset<100UL> *)
                             CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                             (size_t)in_stack_fffffffffffff918);
          if (!bVar2) {
            bVar2 = std::bitset<100UL>::operator[]
                              ((bitset<100UL> *)
                               CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                               (size_t)in_stack_fffffffffffff918);
            if (bVar2) {
              std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2b71bf);
              QueryCompiler::numberOfViews((QueryCompiler *)0x2b71c7);
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                        (in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928,
                         (bool)in_stack_fffffffffffff927);
            }
            else {
              local_178 = 0;
              while( true ) {
                uVar1 = local_178;
                std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2b729d);
                sVar3 = QueryCompiler::numberOfViews((QueryCompiler *)0x2b72a5);
                if (sVar3 <= uVar1) break;
                bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                        operator[]((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                                   (size_type)in_stack_fffffffffffff918);
                if (bVar2) {
                  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2b7307);
                  pVVar4 = QueryCompiler::getView
                                     ((QueryCompiler *)
                                      CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                                      (size_t)in_stack_fffffffffffff918);
                  local_180 = &pVVar4->_fVars;
                  bVar2 = std::bitset<100UL>::operator[]
                                    ((bitset<100UL> *)
                                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                                     (size_t)in_stack_fffffffffffff918);
                  if (bVar2) {
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                              (in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928,
                               (bool)in_stack_fffffffffffff927);
                    break;
                  }
                }
                local_178 = local_178 + 1;
              }
            }
          }
        }
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (in_stack_fffffffffffff938);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
                (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b73f5);
      bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                                in_stack_fffffffffffff918);
      if (bVar2) {
        std::bitset<1500UL>::set
                  ((bitset<1500UL> *)in_stack_fffffffffffff930,(size_t)in_stack_fffffffffffff928,
                   (bool)in_stack_fffffffffffff927);
      }
      else {
        boost::operator&(in_stack_fffffffffffff968,in_stack_fffffffffffff960);
        bVar2 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                                  in_stack_fffffffffffff918);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b74b1);
        if (bVar2) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    (in_stack_fffffffffffff938);
          boost::operator&(in_stack_fffffffffffff968,in_stack_fffffffffffff960);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b7504);
          bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                            (in_stack_fffffffffffff928);
          if (bVar2) {
            local_208 = 0;
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2b7547);
            local_210 = QueryCompiler::numberOfViews((QueryCompiler *)0x2b754f);
            for (; local_210 != 0; local_210 = local_210 - 1) {
              rVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                       operator[](in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928);
              local_220 = rVar10;
              bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool
                                ((reference *)&local_220);
              if (bVar2) {
                local_208 = local_210;
                break;
              }
            }
            local_228 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                        find_next(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
            if (local_228 == 0xffffffffffffffff) {
              poVar5 = std::operator<<((ostream *)&std::cerr,
                                       "We found a remaining Loop which is not higher ");
              std::operator<<(poVar5," than the highest considered loop?!\n");
              exit(1);
            }
            boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                      (in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928,
                       (bool)in_stack_fffffffffffff927);
          }
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b772b);
        }
      }
    }
    local_150 = local_150 + 1;
  } while( true );
}

Assistant:

prod_bitset CppGenerator::computeLoopMasks(
    prod_bitset presentFunctions, dyn_bitset consideredLoops,
    const var_bitset& varOrderBitset, const var_bitset& relationBag,
    const dyn_bitset& contributingViews, dyn_bitset& nextVariable,
    const dyn_bitset& prefixLoops)
{
    dyn_bitset loopFactors(_qc->numberOfViews()+1);
    dyn_bitset nextLoops(_qc->numberOfViews()+1);
    
    prod_bitset loopFunctionMask;
    
    // then find all loops required to compute these functions and create masks
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (presentFunctions[f])
        {
            const var_bitset& functionVars = _qc->getFunction(f)->_fVars;
            loopFactors.reset();
            
            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {
                if (functionVars[v] && !varOrderBitset[v])
                {
                    if (relationBag[v])
                        loopFactors.set(_qc->numberOfViews());
                    else
                    {
                        for (size_t incID = 0; incID < _qc->numberOfViews(); ++incID)
                        {
                            if (contributingViews[incID])
                            {
                                const var_bitset& incViewBitset =
                                    _qc->getView(incID)->_fVars;

                                if (incViewBitset[v])
                                {
                                    loopFactors.set(incID);
                                    break;
                                }
                            }
                        }
                    }
                }
            }

            loopFactors &= ~prefixLoops;
            
            if (loopFactors == consideredLoops)
            {
                // Add this function to the mask for this loop
                loopFunctionMask.set(f);
            }
            else
            {
                if ((consideredLoops & loopFactors) == consideredLoops)
                {
                    dyn_bitset remainingLoops = loopFactors & ~consideredLoops;
                    if (remainingLoops.any())
                    {
                        size_t highestPosition = 0;
                        // need to continue with this the next loop
                        for (size_t view=_qc->numberOfViews(); view > 0; view--)
                        {
                            if (consideredLoops[view])
                            {
                                highestPosition = view;
                                break;
                            }
                        }

                        size_t next = remainingLoops.find_next(highestPosition);
                        if (next != boost::dynamic_bitset<>::npos)
                            nextLoops.set(next);
                        else
                        {
                            ERROR("We found a remaining Loop which is not higher " <<
                                  " than the highest considered loop?!\n");
                            exit(1);
                        }
                    }
                }
            }
        }
    }

    // Then use the registrar to split the functions to their loops
    
    size_t numOfLoops = listOfLoops.size();
    listOfLoops.push_back(consideredLoops);
    functionsPerLoop.push_back(loopFunctionMask);
    functionsPerLoopBranch.push_back(loopFunctionMask);
    viewsPerLoop.push_back(nextVariable);
    nextLoopsPerLoop.push_back(std::vector<size_t>());
        
    std::vector<size_t>& nextLoopIDs = nextLoopsPerLoop[numOfLoops];

    presentFunctions &= ~loopFunctionMask;

    // Recurse to the next loops
    for (size_t viewID=0; viewID < _qc->numberOfViews() + 1; ++viewID)
    {
        if (nextLoops[viewID])
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(viewID);

            nextVariable.reset();
            nextVariable.set(viewID);
            
            nextLoopIDs.push_back(listOfLoops.size());
            
            prod_bitset nextLoopFunctions = computeLoopMasks(
                presentFunctions,nextConsideredLoops,varOrderBitset,
                relationBag,contributingViews,nextVariable, prefixLoops);
            
            functionsPerLoopBranch[numOfLoops] |= nextLoopFunctions;
        }
    }
    
    return functionsPerLoopBranch[numOfLoops];
}